

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fp-impl.inc.c
# Opt level: O0

void gen_lfqx(DisasContext_conflict10 *ctx)

{
  TCGContext_conflict10 *tcg_ctx_00;
  uint32_t regno;
  TCGv_i64 EA;
  TCGv_i64 val;
  TCGv_i64 t1;
  TCGv_i64 t0;
  int rd;
  TCGContext_conflict10 *tcg_ctx;
  DisasContext_conflict10 *ctx_local;
  
  tcg_ctx_00 = ctx->uc->tcg_ctx;
  regno = rD(ctx->opcode);
  gen_set_access_type(ctx,0x30);
  EA = tcg_temp_new_i64(tcg_ctx_00);
  val = tcg_temp_new_i64(tcg_ctx_00);
  gen_addr_reg_index(ctx,EA);
  gen_qemu_ld64_i64(ctx,val,EA);
  set_fpr(tcg_ctx_00,regno,val);
  gen_addr_add(ctx,EA,EA,8);
  gen_qemu_ld64_i64(ctx,val,EA);
  set_fpr(tcg_ctx_00,(int)(regno + 1) % 0x20,val);
  tcg_temp_free_i64(tcg_ctx_00,EA);
  tcg_temp_free_i64(tcg_ctx_00,val);
  return;
}

Assistant:

static void gen_lfqx(DisasContext *ctx)
{
    TCGContext *tcg_ctx = ctx->uc->tcg_ctx;
    int rd = rD(ctx->opcode);
    TCGv t0;
    TCGv_i64 t1;
    gen_set_access_type(ctx, ACCESS_FLOAT);
    t0 = tcg_temp_new(tcg_ctx);
    t1 = tcg_temp_new_i64(tcg_ctx);
    gen_addr_reg_index(ctx, t0);
    gen_qemu_ld64_i64(ctx, t1, t0);
    set_fpr(tcg_ctx, rd, t1);
    gen_addr_add(ctx, t0, t0, 8);
    gen_qemu_ld64_i64(ctx, t1, t0);
    set_fpr(tcg_ctx, (rd + 1) % 32, t1);
    tcg_temp_free(tcg_ctx, t0);
    tcg_temp_free_i64(tcg_ctx, t1);
}